

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O1

ssize_t __thiscall
gmlc::networking::TcpConnection::send
          (TcpConnection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  undefined4 in_register_00000034;
  void *pvVar6;
  uint uVar7;
  string local_50;
  void *pvVar4;
  
  if ((((this->connected).activated._M_base._M_i & 1U) == 0) ||
     (((this->connectionError)._M_base._M_i & 1U) != 0)) {
    bVar2 = waitUntilConnected(this,(milliseconds)0x12c);
    if (!bVar2) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"connection timeout waiting again","");
      logger(this,0,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    bVar2 = waitUntilConnected(this,(milliseconds)0xc8);
    if (!bVar2) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"connection timeout twice, now returning","");
      logger(this,0,&local_50);
      goto LAB_0042771b;
    }
  }
  peVar1 = (this->socket_).super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  iVar3 = (**peVar1->_vptr_Socket)(peVar1,CONCAT44(in_register_00000034,__fd),__buf);
  pvVar4 = (void *)CONCAT44(extraout_var,iVar3);
  if (pvVar4 == __buf) {
    return (ssize_t)__buf;
  }
  uVar7 = 0;
  lVar5 = 0;
  pvVar6 = __buf;
  do {
    if (uVar7 == 4) goto LAB_004276b9;
    pvVar6 = (void *)((long)pvVar6 - (long)pvVar4);
    lVar5 = lVar5 + (long)pvVar4;
    peVar1 = (this->socket_).
             super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar3 = (**peVar1->_vptr_Socket)(peVar1,CONCAT44(in_register_00000034,__fd) + lVar5,pvVar6);
    pvVar4 = (void *)CONCAT44(extraout_var_00,iVar3);
    uVar7 = uVar7 + 1;
  } while (pvVar4 != pvVar6);
  if (uVar7 < 4) {
    return (ssize_t)__buf;
  }
LAB_004276b9:
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"TcpConnection send terminated","");
  logger(this,0,&local_50);
LAB_0042771b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

size_t TcpConnection::send(const void* buffer, size_t dataLength)
{
    if (!isConnected()) {
        if (!waitUntilConnected(300ms)) {
            logger(0, "connection timeout waiting again");
        }
        if (!waitUntilConnected(200ms)) {
            logger(0, "connection timeout twice, now returning");
            return 0;
        }
    }

    size_t sz{0};
    size_t sent_size{dataLength};
    size_t p{0};
    int count{0};
    while (count++ < 5 &&
           (sz = socket_->write_some(
                reinterpret_cast<const char*>(buffer) + p, sent_size)) !=
               sent_size) {
        sent_size -= sz;
        p += sz;
        //   std::cerr << "DEBUG partial buffer sent" << std::endl;
    }
    if (count >= 5) {
        logger(0, "TcpConnection send terminated");
        return 0;
    }
    return dataLength;

    //  assert(sz == dataLength);
    //  return sz;
}